

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O3

png_uint_32 png_get_pixels_per_inch(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  uint uVar1;
  png_uint_32 pVar2;
  undefined8 uStack_8;
  
  if (((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      ((info_ptr->valid & 0x80) != 0)) && (info_ptr->phys_unit_type == '\x01')) {
    uVar1 = info_ptr->x_pixels_per_unit;
    uStack_8 = (ulong)uVar1;
    if (uVar1 == info_ptr->y_pixels_per_unit) {
      if ((int)uVar1 < 0) {
        return 0;
      }
      goto LAB_0010e0e4;
    }
  }
  uStack_8 = 0;
LAB_0010e0e4:
  pVar2 = png_muldiv((png_fixed_point_p)((long)&uStack_8 + 4),(png_fixed_point)uStack_8,0x7f,5000);
  if (pVar2 != 0) {
    pVar2 = uStack_8._4_4_;
  }
  return pVar2;
}

Assistant:

png_uint_32 PNGAPI
png_get_pixels_per_meter(png_const_structrp png_ptr, png_const_inforp info_ptr)
{
#ifdef PNG_pHYs_SUPPORTED
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_pHYs) != 0)
   {
      png_debug1(1, "in %s retrieval function", "png_get_pixels_per_meter");

      if (info_ptr->phys_unit_type == PNG_RESOLUTION_METER &&
          info_ptr->x_pixels_per_unit == info_ptr->y_pixels_per_unit)
         return (info_ptr->x_pixels_per_unit);
   }
#else
   PNG_UNUSED(png_ptr)
   PNG_UNUSED(info_ptr)
#endif

   return (0);
}